

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O1

bool __thiscall pstore::broker::gc_watch_thread::stop_vacuum(gc_watch_thread *this,string *path)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  not_null<const_char_*> nVar4;
  int *piVar5;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_1;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar6;
  long *in_FS_OFFSET;
  maybe<int,_void> pid;
  maybe<int,_void> local_48;
  not_null<const_char_*> local_40;
  not_null<const_char_*> local_38;
  
  get_pid(&local_48,this,path);
  bVar3 = local_48.valid_;
  if (local_48.valid_ == true) {
    local_38.ptr_ = (path->_M_dataplus)._M_p;
    gsl::not_null<const_char_*>::ensure_invariant(&local_38);
    nVar4.ptr_ = local_38.ptr_;
    pstore::details::log_destinations::__tls_init();
    lVar1 = *in_FS_OFFSET;
    if (*(long *)(lVar1 + -8) != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar6 = *(undefined8 **)(lVar1 + -8);
      puVar2 = (undefined8 *)puVar6[1];
      for (puVar6 = (undefined8 *)*puVar6; puVar6 != puVar2; puVar6 = puVar6 + 1) {
        (**(code **)(*(long *)*puVar6 + 0x58))((long *)*puVar6,6,"Killing GC for ",nVar4.ptr_);
      }
    }
    piVar5 = maybe<int,_void>::operator->(&local_48);
    (*this->_vptr_gc_watch_thread[3])(this,piVar5);
    bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>>::
    erasel<std::__cxx11::string>
              ((bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>> *)
               &this->processes_,path);
  }
  if (local_48.valid_ == true) {
    local_48.valid_ = false;
  }
  if (bVar3 == false) {
    local_40.ptr_ = (path->_M_dataplus)._M_p;
    gsl::not_null<const_char_*>::ensure_invariant(&local_40);
    nVar4.ptr_ = local_40.ptr_;
    pstore::details::log_destinations::__tls_init();
    lVar1 = *in_FS_OFFSET;
    if (*(long *)(lVar1 + -8) != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar6 = *(undefined8 **)(lVar1 + -8);
      puVar2 = (undefined8 *)puVar6[1];
      for (puVar6 = (undefined8 *)*puVar6; puVar6 != puVar2; puVar6 = puVar6 + 1) {
        (**(code **)(*(long *)*puVar6 + 0x58))
                  ((long *)*puVar6,6,"No GC process running for ",nVar4.ptr_);
      }
    }
  }
  return bVar3;
}

Assistant:

bool gc_watch_thread::stop_vacuum (std::string const & path) {
            if (maybe<process_identifier> const pid = this->get_pid (path)) {
                log (priority::info, "Killing GC for ", logger::quoted{path.c_str ()});
                this->kill (*pid);
                processes_.erasel (path);
                return true;
            }
            log (priority::info, "No GC process running for ", logger::quoted{path.c_str ()});
            return false;
        }